

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::Multiply
          (TPZTensor<TFad<6,_double>_> *this,TPZTensor<TFad<6,_double>_> *tensor,
          TPZTensor<TFad<6,_double>_> *resp)

{
  TPZTensor<TFad<6,_double>_> *pTVar1;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_208;
  TPZTensor<TFad<6,_double>_> *local_1f8;
  TFad<6,_double> local_1f0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_1b0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_1a0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_190;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_180;
  TFad<6,_double> local_170;
  TFad<6,_double> local_130;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  local_1f8 = tensor;
  TFad<6,_double>::TFad(&local_b0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore);
  TFad<6,_double>::TFad(&local_f0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3);
  TFad<6,_double>::TFad(&local_70,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5);
  TFad<6,_double>::TFad(&local_1f0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  TFad<6,_double>::TFad(&local_130,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  TFad<6,_double>::TFad(&local_170,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4);
  local_190.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1a0.fadexpr_.right_ = local_190.fadexpr_.right_ + 1;
  local_1b0.fadexpr_.right_ = local_190.fadexpr_.right_ + 2;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_1b0.fadexpr_.left_ = &local_130;
  local_1a0.fadexpr_.left_ = &local_1f0;
  local_190.fadexpr_.left_ = &local_b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)(resp->fData).super_TPZVec<TFad<6,_double>_>.fStore,&local_208);
  local_1b0.fadexpr_.right_ = (local_1f8->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_190.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 1;
  local_190.fadexpr_.left_ = &local_1f0;
  local_1a0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 3;
  local_1a0.fadexpr_.left_ = &local_f0;
  local_1b0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 4;
  local_1b0.fadexpr_.left_ = &local_170;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((resp->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3),&local_208)
  ;
  pTVar1 = local_1f8;
  local_1b0.fadexpr_.right_ = (local_1f8->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_190.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 2;
  local_190.fadexpr_.left_ = &local_130;
  local_1a0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 4;
  local_1a0.fadexpr_.left_ = &local_170;
  local_1b0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 5;
  local_1b0.fadexpr_.left_ = &local_70;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((resp->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5),&local_208)
  ;
  local_1b0.fadexpr_.right_ = (pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_190.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 1;
  local_190.fadexpr_.left_ = &local_b0;
  local_1a0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 3;
  local_1a0.fadexpr_.left_ = &local_1f0;
  local_1b0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 4;
  local_1b0.fadexpr_.left_ = &local_130;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((resp->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1),&local_208)
  ;
  local_1b0.fadexpr_.right_ = (pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_190.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 2;
  local_190.fadexpr_.left_ = &local_b0;
  local_1a0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 4;
  local_1a0.fadexpr_.left_ = &local_1f0;
  local_1b0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 5;
  local_1b0.fadexpr_.left_ = &local_130;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((resp->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2),&local_208)
  ;
  local_1b0.fadexpr_.right_ = (pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_190.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 2;
  local_190.fadexpr_.left_ = &local_1f0;
  local_1a0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 4;
  local_1a0.fadexpr_.left_ = &local_f0;
  local_1b0.fadexpr_.right_ = local_1b0.fadexpr_.right_ + 5;
  local_1b0.fadexpr_.left_ = &local_170;
  local_208.fadexpr_.left_ = &local_180;
  local_208.fadexpr_.right_ = &local_1b0;
  local_180.fadexpr_.left_ = &local_190;
  local_180.fadexpr_.right_ = &local_1a0;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((resp->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4),&local_208)
  ;
  return;
}

Assistant:

void TPZTensor<T>::Multiply(const TPZTensor<T> tensor, TPZTensor<T> & resp) const {
    const T XX = this->fData[_XX_];
    const T YY = this->fData[_YY_];
    const T ZZ = this->fData[_ZZ_];
    const T XY = this->fData[_XY_];
    const T XZ = this->fData[_XZ_];
    const T YZ = this->fData[_YZ_];
    resp.fData[_XX_] = XX * tensor.XX() + XY * tensor.XY() + XZ * tensor.XZ();
    resp.fData[_YY_] = XY * tensor.XY() + YY * tensor.YY() + YZ * tensor.YZ();
    resp.fData[_ZZ_] = XZ * tensor.XZ() + YZ * tensor.YZ() + ZZ * tensor.ZZ();
    resp.fData[_XY_] = XX * tensor.XY() + XY * tensor.YY() + XZ * tensor.YZ();
    resp.fData[_XZ_] = XX * tensor.XZ() + XY * tensor.YZ() + XZ * tensor.ZZ();
    resp.fData[_YZ_] = XY * tensor.XZ() + YY * tensor.YZ() + YZ * tensor.ZZ();
}